

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoel.cpp
# Opt level: O0

bool __thiscall TPZGeoEl::VerifyNodeCoordinates(TPZGeoEl *this,REAL tol)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  ostream *poVar4;
  long *in_RDI;
  double in_XMM0_Qa;
  REAL RVar5;
  stringstream mess;
  size_t in_stack_00000108;
  char *in_stack_00000110;
  int dim_1;
  REAL error;
  int dim;
  int inode;
  TPZManVector<double,_3> NodeX;
  TPZManVector<double,_3> MappedX;
  TPZManVector<double,_3> qsi;
  int nnodes;
  TPZManVector<double,_3> *in_stack_fffffffffffffcf0;
  TPZGeoNode *in_stack_fffffffffffffcf8;
  TPZGeoEl *in_stack_fffffffffffffd00;
  int64_t in_stack_fffffffffffffd08;
  double dVar6;
  TPZManVector<double,_3> *in_stack_fffffffffffffd10;
  string local_298 [32];
  stringstream local_278 [16];
  ostream local_268 [380];
  int local_ec;
  double local_e8;
  int local_e0;
  int local_dc;
  TPZVec<double> local_d8 [2];
  TPZVec<double> local_90;
  undefined1 local_58 [60];
  int local_1c;
  double local_18;
  byte local_1;
  
  local_18 = in_XMM0_Qa;
  local_1c = (**(code **)(*in_RDI + 0x98))();
  (**(code **)(*in_RDI + 0x210))();
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  local_dc = 0;
  do {
    if (local_1c <= local_dc) {
      local_1 = 1;
LAB_01b393d1:
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffcf0);
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffcf0);
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffcf0);
      return (bool)(local_1 & 1);
    }
    for (local_e0 = 0; local_e0 < 3; local_e0 = local_e0 + 1) {
      NodePtr(in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      RVar5 = TPZGeoNode::Coord(in_stack_fffffffffffffcf8,
                                (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      pdVar3 = TPZVec<double>::operator[](local_d8,(long)local_e0);
      *pdVar3 = RVar5;
    }
    (**(code **)(*in_RDI + 0x260))(in_RDI,local_dc,local_58);
    (**(code **)(*in_RDI + 0x228))(in_RDI,local_58,&local_90);
    local_e8 = 0.0;
    for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
      pdVar3 = TPZVec<double>::operator[](local_d8,(long)local_ec);
      dVar1 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_ec);
      dVar2 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](local_d8,(long)local_ec);
      dVar6 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_ec);
      local_e8 = (dVar1 - dVar2) * (dVar6 - *pdVar3) + local_e8;
    }
    local_e8 = sqrt(local_e8);
    if ((local_18 < local_e8) || (NAN(local_e8))) {
      std::__cxx11::stringstream::stringstream(local_278);
      poVar4 = std::operator<<(local_268,"FATAL ERROR AT ");
      poVar4 = std::operator<<(poVar4,"bool TPZGeoEl::VerifyNodeCoordinates(REAL)");
      std::operator<<(poVar4," - Node coordinate differs from mapped node.\n");
      (**(code **)(*in_RDI + 0x1a0))(in_RDI,local_268);
      std::__cxx11::stringstream::str();
      in_stack_fffffffffffffcf0 =
           (TPZManVector<double,_3> *)std::operator<<((ostream *)&std::cerr,local_298);
      std::operator<<((ostream *)in_stack_fffffffffffffcf0,"\n");
      std::__cxx11::string::~string(local_298);
      pzinternal::DebugStopImpl(in_stack_00000110,in_stack_00000108);
      local_1 = 0;
      std::__cxx11::stringstream::~stringstream(local_278);
      goto LAB_01b393d1;
    }
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

bool TPZGeoEl::VerifyNodeCoordinates(REAL tol){
	const int nnodes = this->NCornerNodes();
	TPZManVector<REAL,3> qsi(this->Dimension());
	TPZManVector<REAL,3> MappedX(3), NodeX(3);
	for(int inode = 0; inode < nnodes; inode++){
		for(int dim = 0; dim < 3; dim++){
			NodeX[dim] = this->NodePtr(inode)->Coord(dim);
		}//dim
		this->CenterPoint(inode,qsi);
		this->X(qsi,MappedX);
		REAL error = 0.;
		for(int dim = 0; dim < 3; dim++){
			error += (NodeX[dim]-MappedX[dim])*(NodeX[dim]-MappedX[dim]);
		}//dim
		error = sqrt(error);
		if(error > tol || !(error==error)){
			std::stringstream mess;
			mess << "FATAL ERROR AT " << __PRETTY_FUNCTION__ << " - Node coordinate differs from mapped node.\n";
			this->Print(mess);
			PZError << mess.str() << "\n";
#ifdef PZ_LOG
			LOGPZ_ERROR(logger,mess.str().c_str());
#endif
			DebugStop();
			return false;
		}
	}//for i
	return true;
}